

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O3

void despot::AEMS::Update(VNode *vnode)

{
  bool bVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  QNode *this;
  ulong uVar3;
  double value;
  double dVar4;
  double local_28;
  double local_20;
  
  bVar1 = VNode::IsLeaf(vnode);
  if (!bVar1) {
    local_28 = -INFINITY;
    pvVar2 = VNode::children(vnode);
    if ((pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      value = -INFINITY;
      local_20 = -INFINITY;
    }
    else {
      uVar3 = 0;
      dVar4 = -INFINITY;
      do {
        this = VNode::Child(vnode,(ACT_TYPE)uVar3);
        local_20 = QNode::lower_bound(this);
        if (local_20 <= local_28) {
          local_20 = local_28;
        }
        value = QNode::upper_bound(this);
        if (value <= dVar4) {
          value = dVar4;
        }
        uVar3 = uVar3 + 1;
        pvVar2 = VNode::children(vnode);
        dVar4 = value;
        local_28 = local_20;
      } while (uVar3 < (ulong)((long)(pvVar2->
                                     super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    dVar4 = VNode::lower_bound(vnode);
    if (dVar4 < local_20) {
      VNode::lower_bound(vnode,local_20);
    }
    dVar4 = VNode::upper_bound(vnode);
    if (value < dVar4) {
      VNode::upper_bound(vnode,value);
      return;
    }
  }
  return;
}

Assistant:

void AEMS::Update(VNode* vnode) {
	if (vnode->IsLeaf())
		return;

	double lower = Globals::NEG_INFTY;
	double upper = Globals::NEG_INFTY;

	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		lower = max(lower, qnode->lower_bound());
		upper = max(upper, qnode->upper_bound());
	}

	if (lower > vnode->lower_bound())
		vnode->lower_bound(lower);
	if (upper < vnode->upper_bound())
		vnode->upper_bound(upper);
}